

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.h
# Opt level: O2

bool __thiscall TaprootBuilder::IsComplete(TaprootBuilder *this)

{
  pointer poVar1;
  undefined1 uVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  if (this->m_valid == true) {
    poVar1 = (this->m_branch).
             super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->m_branch).
                  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)poVar1 >> 6;
    if (lVar3 == 0) {
      uVar2 = 1;
      goto LAB_0058f217;
    }
    if (lVar3 == 1) {
      uVar2 = *(bool *)((long)&(poVar1->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>
                               )._M_payload.
                               super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>
                       + 0x38);
      goto LAB_0058f217;
    }
  }
  uVar2 = 0;
LAB_0058f217:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsComplete() const { return m_valid && (m_branch.size() == 0 || (m_branch.size() == 1 && m_branch[0].has_value())); }